

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_compressBlock_lazy2_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *ilimit_w;
  ZSTD_compressionParameters *cParams_00;
  ulong *iEnd;
  ulong *puVar4;
  undefined8 *puVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  BYTE *pBVar9;
  BYTE *pBVar10;
  U32 *pUVar11;
  seqDef *psVar12;
  bool bVar13;
  undefined8 uVar14;
  int iVar15;
  uint uVar16;
  U32 UVar17;
  size_t sVar18;
  BYTE *pBVar19;
  BYTE *pBVar20;
  BYTE *pBVar21;
  ulong uVar22;
  BYTE *pBVar23;
  int iVar24;
  uint uVar25;
  BYTE *iStart;
  ulong *puVar26;
  ulong *puVar27;
  ulong *puVar28;
  BYTE *pBVar29;
  ulong *puVar30;
  long lVar31;
  uint uVar32;
  int iVar33;
  U32 UVar34;
  U32 UVar35;
  ulong uVar36;
  ulong *puVar37;
  ulong *ip;
  ulong uVar38;
  int iVar39;
  uint uVar40;
  uint uVar41;
  U32 UVar42;
  ZSTD_compressionParameters *cParams;
  ulong local_168;
  BYTE *local_140;
  ulong local_e8;
  
  iEnd = (ulong *)((long)src + srcSize);
  puVar4 = (ulong *)((long)src + (srcSize - 8));
  pBVar9 = (ms->window).base;
  uVar6 = (ms->window).dictLimit;
  iStart = pBVar9 + uVar6;
  UVar35 = *rep;
  UVar42 = rep[1];
  ip = (ulong *)((ulong)(iStart == (BYTE *)src) + (long)src);
  if (ip < puVar4) {
    pBVar10 = (ms->window).dictBase;
    uVar7 = (ms->window).lowLimit;
    puVar37 = (ulong *)(pBVar10 + uVar6);
    iVar24 = uVar6 - 1;
    cParams_00 = &ms->cParams;
    puVar1 = (ulong *)((long)iEnd - 7);
    puVar2 = (ulong *)((long)iEnd - 3);
    puVar3 = (ulong *)((long)iEnd - 1);
    ilimit_w = iEnd + -4;
    do {
      iVar33 = (int)ip;
      iVar15 = iVar33 - (int)pBVar9;
      uVar16 = (iVar15 - UVar35) + 1;
      pBVar19 = pBVar9;
      if (uVar16 < uVar6) {
        pBVar19 = pBVar10;
      }
      if ((uVar7 < uVar16 && 2 < iVar24 - uVar16) &&
         (*(int *)((long)ip + 1) == *(int *)(pBVar19 + uVar16))) {
        puVar30 = iEnd;
        if (uVar16 < uVar6) {
          puVar30 = puVar37;
        }
        sVar18 = ZSTD_count_2segments
                           ((BYTE *)((long)ip + 5),(BYTE *)((long)(pBVar19 + uVar16) + 4),
                            (BYTE *)iEnd,(BYTE *)puVar30,iStart);
        pBVar19 = (BYTE *)(sVar18 + 4);
      }
      else {
        pBVar19 = (BYTE *)0x0;
      }
      uVar16 = (ms->cParams).minMatch;
      if (uVar16 - 6 < 2) {
        uVar32 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
        pBVar23 = (ms->window).base;
        uVar40 = iVar33 - (int)pBVar23;
        uVar16 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        UVar17 = (ms->window).lowLimit;
        UVar34 = uVar40 - uVar16;
        if (uVar40 - UVar17 <= uVar16) {
          UVar34 = UVar17;
        }
        pUVar11 = ms->chainTable;
        pBVar29 = (ms->window).dictBase;
        uVar16 = (ms->window).dictLimit;
        if (ms->loadedDictEnd != 0) {
          UVar34 = UVar17;
        }
        uVar25 = uVar40 - uVar32;
        if (uVar40 < uVar32) {
          uVar25 = 0;
        }
        uVar41 = (ms->cParams).searchLog;
        UVar17 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams_00,(BYTE *)ip,6);
        if (UVar17 <= UVar34) goto LAB_00130460;
        iVar33 = 1 << ((byte)uVar41 & 0x1f);
        local_e8 = 999999999;
        pBVar21 = (BYTE *)0x3;
        do {
          if (UVar17 < uVar16) {
            if (pBVar29 + uVar16 < pBVar29 + (ulong)UVar17 + 4) {
LAB_00131bc7:
              __assert_fail("match+4 <= dictEnd",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x40dd,
                            "size_t ZSTD_HcFindBestMatch_generic(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                           );
            }
            if (*(int *)(pBVar29 + UVar17) == (int)*ip) {
              sVar18 = ZSTD_count_2segments
                                 ((BYTE *)((long)ip + 4),pBVar29 + (ulong)UVar17 + 4,(BYTE *)iEnd,
                                  pBVar29 + uVar16,pBVar23 + uVar16);
              pBVar20 = (BYTE *)(sVar18 + 4);
            }
            else {
LAB_0012fe73:
              pBVar20 = (BYTE *)0x0;
            }
          }
          else {
            puVar30 = (ulong *)(pBVar23 + UVar17);
            if (pBVar21[(long)puVar30] != *(BYTE *)((long)ip + (long)pBVar21)) goto LAB_0012fe73;
            puVar27 = ip;
            if (ip < puVar1) {
              uVar22 = *ip ^ *puVar30;
              uVar36 = 0;
              if (uVar22 != 0) {
                for (; (uVar22 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                }
              }
              pBVar20 = (BYTE *)(uVar36 >> 3 & 0x1fffffff);
              if (*puVar30 == *ip) {
                do {
                  puVar27 = puVar27 + 1;
                  puVar30 = puVar30 + 1;
                  if (puVar1 <= puVar27) goto LAB_0012fe7a;
                  uVar22 = *puVar27 ^ *puVar30;
                  uVar36 = 0;
                  if (uVar22 != 0) {
                    for (; (uVar22 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                    }
                  }
                  pBVar20 = (BYTE *)((long)puVar27 + ((uVar36 >> 3 & 0x1fffffff) - (long)ip));
                } while (*puVar30 == *puVar27);
              }
            }
            else {
LAB_0012fe7a:
              if ((puVar27 < puVar2) && ((int)*puVar30 == (int)*puVar27)) {
                puVar27 = (ulong *)((long)puVar27 + 4);
                puVar30 = (ulong *)((long)puVar30 + 4);
              }
              if ((puVar27 < puVar3) && ((short)*puVar30 == (short)*puVar27)) {
                puVar27 = (ulong *)((long)puVar27 + 2);
                puVar30 = (ulong *)((long)puVar30 + 2);
              }
              if (puVar27 < iEnd) {
                puVar27 = (ulong *)((long)puVar27 + (ulong)((BYTE)*puVar30 == (BYTE)*puVar27));
              }
              pBVar20 = (BYTE *)((long)puVar27 - (long)ip);
            }
          }
          if ((pBVar21 < pBVar20) &&
             (local_e8 = (ulong)((uVar40 + 2) - UVar17), pBVar21 = pBVar20,
             (ulong *)(pBVar20 + (long)ip) == iEnd)) {
            bVar13 = false;
          }
          else {
            pBVar20 = pBVar21;
            if (uVar25 < UVar17) {
              UVar17 = pUVar11[UVar17 & uVar32 - 1];
              bVar13 = true;
            }
            else {
              bVar13 = false;
            }
          }
        } while (((bVar13) && (UVar34 < UVar17)) &&
                (iVar33 = iVar33 + -1, pBVar21 = pBVar20, iVar33 != 0));
      }
      else if (uVar16 == 5) {
        uVar32 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
        pBVar23 = (ms->window).base;
        uVar40 = iVar33 - (int)pBVar23;
        uVar16 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        UVar17 = (ms->window).lowLimit;
        UVar34 = uVar40 - uVar16;
        if (uVar40 - UVar17 <= uVar16) {
          UVar34 = UVar17;
        }
        pUVar11 = ms->chainTable;
        pBVar29 = (ms->window).dictBase;
        uVar16 = (ms->window).dictLimit;
        if (ms->loadedDictEnd != 0) {
          UVar34 = UVar17;
        }
        uVar25 = uVar40 - uVar32;
        if (uVar40 < uVar32) {
          uVar25 = 0;
        }
        uVar41 = (ms->cParams).searchLog;
        UVar17 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams_00,(BYTE *)ip,5);
        if (UVar34 < UVar17) {
          iVar33 = 1 << ((byte)uVar41 & 0x1f);
          local_e8 = 999999999;
          pBVar21 = (BYTE *)0x3;
          do {
            if (UVar17 < uVar16) {
              if (pBVar29 + uVar16 < pBVar29 + (ulong)UVar17 + 4) goto LAB_00131bc7;
              if (*(int *)(pBVar29 + UVar17) == (int)*ip) {
                sVar18 = ZSTD_count_2segments
                                   ((BYTE *)((long)ip + 4),pBVar29 + (ulong)UVar17 + 4,(BYTE *)iEnd,
                                    pBVar29 + uVar16,pBVar23 + uVar16);
                pBVar20 = (BYTE *)(sVar18 + 4);
              }
              else {
LAB_00130118:
                pBVar20 = (BYTE *)0x0;
              }
            }
            else {
              puVar30 = (ulong *)(pBVar23 + UVar17);
              if (pBVar21[(long)puVar30] != *(BYTE *)((long)ip + (long)pBVar21)) goto LAB_00130118;
              puVar27 = ip;
              if (ip < puVar1) {
                uVar22 = *ip ^ *puVar30;
                uVar36 = 0;
                if (uVar22 != 0) {
                  for (; (uVar22 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                  }
                }
                pBVar20 = (BYTE *)(uVar36 >> 3 & 0x1fffffff);
                if (*puVar30 == *ip) {
                  do {
                    puVar27 = puVar27 + 1;
                    puVar30 = puVar30 + 1;
                    if (puVar1 <= puVar27) goto LAB_0013011f;
                    uVar22 = *puVar27 ^ *puVar30;
                    uVar36 = 0;
                    if (uVar22 != 0) {
                      for (; (uVar22 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                      }
                    }
                    pBVar20 = (BYTE *)((long)puVar27 + ((uVar36 >> 3 & 0x1fffffff) - (long)ip));
                  } while (*puVar30 == *puVar27);
                }
              }
              else {
LAB_0013011f:
                if ((puVar27 < puVar2) && ((int)*puVar30 == (int)*puVar27)) {
                  puVar27 = (ulong *)((long)puVar27 + 4);
                  puVar30 = (ulong *)((long)puVar30 + 4);
                }
                if ((puVar27 < puVar3) && ((short)*puVar30 == (short)*puVar27)) {
                  puVar27 = (ulong *)((long)puVar27 + 2);
                  puVar30 = (ulong *)((long)puVar30 + 2);
                }
                if (puVar27 < iEnd) {
                  puVar27 = (ulong *)((long)puVar27 + (ulong)((BYTE)*puVar30 == (BYTE)*puVar27));
                }
                pBVar20 = (BYTE *)((long)puVar27 - (long)ip);
              }
            }
            if ((pBVar21 < pBVar20) &&
               (local_e8 = (ulong)((uVar40 + 2) - UVar17), pBVar21 = pBVar20,
               (ulong *)(pBVar20 + (long)ip) == iEnd)) {
              bVar13 = false;
            }
            else {
              pBVar20 = pBVar21;
              if (uVar25 < UVar17) {
                UVar17 = pUVar11[UVar17 & uVar32 - 1];
                bVar13 = true;
              }
              else {
                bVar13 = false;
              }
            }
          } while (((bVar13) && (UVar34 < UVar17)) &&
                  (iVar33 = iVar33 + -1, pBVar21 = pBVar20, iVar33 != 0));
        }
        else {
LAB_00130460:
          pBVar20 = (BYTE *)0x3;
          local_e8 = 999999999;
        }
      }
      else {
        uVar32 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
        pBVar23 = (ms->window).base;
        uVar40 = iVar33 - (int)pBVar23;
        uVar16 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        UVar17 = (ms->window).lowLimit;
        UVar34 = uVar40 - uVar16;
        if (uVar40 - UVar17 <= uVar16) {
          UVar34 = UVar17;
        }
        pUVar11 = ms->chainTable;
        pBVar29 = (ms->window).dictBase;
        uVar16 = (ms->window).dictLimit;
        if (ms->loadedDictEnd != 0) {
          UVar34 = UVar17;
        }
        uVar25 = uVar40 - uVar32;
        if (uVar40 < uVar32) {
          uVar25 = 0;
        }
        uVar41 = (ms->cParams).searchLog;
        UVar17 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams_00,(BYTE *)ip,4);
        if (UVar17 <= UVar34) goto LAB_00130460;
        iVar33 = 1 << ((byte)uVar41 & 0x1f);
        local_e8 = 999999999;
        pBVar21 = (BYTE *)0x3;
        do {
          if (UVar17 < uVar16) {
            if (pBVar29 + uVar16 < pBVar29 + (ulong)UVar17 + 4) goto LAB_00131bc7;
            if (*(int *)(pBVar29 + UVar17) == (int)*ip) {
              sVar18 = ZSTD_count_2segments
                                 ((BYTE *)((long)ip + 4),pBVar29 + (ulong)UVar17 + 4,(BYTE *)iEnd,
                                  pBVar29 + uVar16,pBVar23 + uVar16);
              pBVar20 = (BYTE *)(sVar18 + 4);
            }
            else {
LAB_001303b4:
              pBVar20 = (BYTE *)0x0;
            }
          }
          else {
            puVar30 = (ulong *)(pBVar23 + UVar17);
            if (pBVar21[(long)puVar30] != *(BYTE *)((long)ip + (long)pBVar21)) goto LAB_001303b4;
            puVar27 = ip;
            if (ip < puVar1) {
              uVar22 = *ip ^ *puVar30;
              uVar36 = 0;
              if (uVar22 != 0) {
                for (; (uVar22 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                }
              }
              pBVar20 = (BYTE *)(uVar36 >> 3 & 0x1fffffff);
              if (*puVar30 == *ip) {
                do {
                  puVar27 = puVar27 + 1;
                  puVar30 = puVar30 + 1;
                  if (puVar1 <= puVar27) goto LAB_001303bb;
                  uVar22 = *puVar27 ^ *puVar30;
                  uVar36 = 0;
                  if (uVar22 != 0) {
                    for (; (uVar22 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                    }
                  }
                  pBVar20 = (BYTE *)((long)puVar27 + ((uVar36 >> 3 & 0x1fffffff) - (long)ip));
                } while (*puVar30 == *puVar27);
              }
            }
            else {
LAB_001303bb:
              if ((puVar27 < puVar2) && ((int)*puVar30 == (int)*puVar27)) {
                puVar27 = (ulong *)((long)puVar27 + 4);
                puVar30 = (ulong *)((long)puVar30 + 4);
              }
              if ((puVar27 < puVar3) && ((short)*puVar30 == (short)*puVar27)) {
                puVar27 = (ulong *)((long)puVar27 + 2);
                puVar30 = (ulong *)((long)puVar30 + 2);
              }
              if (puVar27 < iEnd) {
                puVar27 = (ulong *)((long)puVar27 + (ulong)((BYTE)*puVar30 == (BYTE)*puVar27));
              }
              pBVar20 = (BYTE *)((long)puVar27 - (long)ip);
            }
          }
          if ((pBVar21 < pBVar20) &&
             (local_e8 = (ulong)((uVar40 + 2) - UVar17), pBVar21 = pBVar20,
             (ulong *)(pBVar20 + (long)ip) == iEnd)) {
            bVar13 = false;
          }
          else {
            pBVar20 = pBVar21;
            if (uVar25 < UVar17) {
              UVar17 = pUVar11[UVar17 & uVar32 - 1];
              bVar13 = true;
            }
            else {
              bVar13 = false;
            }
          }
        } while (((bVar13) && (UVar34 < UVar17)) &&
                (iVar33 = iVar33 + -1, pBVar21 = pBVar20, iVar33 != 0));
      }
      local_140 = pBVar19;
      if (pBVar19 < pBVar20) {
        local_140 = pBVar20;
      }
      if (local_140 < (BYTE *)0x4) {
        ip = (ulong *)((long)ip + ((long)ip - (long)src >> 8) + 1);
      }
      else {
        puVar30 = ip;
        if (pBVar20 <= pBVar19) {
          local_e8 = 0;
          ip = (ulong *)((long)ip + 1);
        }
        do {
          do {
            iVar33 = iVar15;
            puVar27 = puVar30;
            if (puVar4 <= puVar27) goto LAB_001317a6;
            puVar30 = (ulong *)((long)puVar27 + 1);
            iVar15 = iVar33 + 1;
            if (local_e8 == 0) {
              local_e8 = 0;
            }
            else {
              uVar16 = iVar15 - UVar35;
              pBVar19 = pBVar9;
              if (uVar16 < uVar6) {
                pBVar19 = pBVar10;
              }
              if ((uVar7 < uVar16 && 2 < iVar24 - uVar16) &&
                 (*(int *)puVar30 == *(int *)(pBVar19 + uVar16))) {
                puVar26 = iEnd;
                if (uVar16 < uVar6) {
                  puVar26 = puVar37;
                }
                sVar18 = ZSTD_count_2segments
                                   ((BYTE *)((long)puVar27 + 5),
                                    (BYTE *)((long)(pBVar19 + uVar16) + 4),(BYTE *)iEnd,
                                    (BYTE *)puVar26,iStart);
                uVar16 = (int)local_e8 + 1;
                if (uVar16 == 0) goto LAB_00131be6;
                if (sVar18 < 0xfffffffffffffffc) {
                  uVar32 = 0x1f;
                  if (uVar16 != 0) {
                    for (; uVar16 >> uVar32 == 0; uVar32 = uVar32 - 1) {
                    }
                  }
                  if ((int)((uVar32 ^ 0x1f) + (int)local_140 * 3 + -0x1e) <
                      (int)(BYTE *)(sVar18 + 4) * 3) {
                    local_e8 = 0;
                    ip = puVar30;
                    local_140 = (BYTE *)(sVar18 + 4);
                  }
                }
              }
            }
            uVar16 = (ms->cParams).minMatch;
            iVar39 = (int)puVar30;
            if (uVar16 - 6 < 2) {
              uVar40 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
              pBVar19 = (ms->window).base;
              uVar32 = iVar39 - (int)pBVar19;
              uVar16 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
              UVar17 = (ms->window).lowLimit;
              UVar34 = uVar32 - uVar16;
              if (uVar32 - UVar17 <= uVar16) {
                UVar34 = UVar17;
              }
              pUVar11 = ms->chainTable;
              pBVar23 = (ms->window).dictBase;
              uVar16 = (ms->window).dictLimit;
              if (ms->loadedDictEnd != 0) {
                UVar34 = UVar17;
              }
              uVar25 = uVar32 - uVar40;
              if (uVar32 < uVar40) {
                uVar25 = 0;
              }
              uVar41 = (ms->cParams).searchLog;
              UVar17 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams_00,(BYTE *)puVar30,6);
              if (UVar17 <= UVar34) goto LAB_00130dc7;
              iVar39 = 1 << ((byte)uVar41 & 0x1f);
              local_168 = 999999999;
              pBVar29 = (BYTE *)0x3;
              do {
                if (UVar17 < uVar16) {
                  if (pBVar23 + uVar16 < pBVar23 + (ulong)UVar17 + 4) goto LAB_00131bc7;
                  if (*(int *)(pBVar23 + UVar17) == *(int *)puVar30) {
                    sVar18 = ZSTD_count_2segments
                                       ((BYTE *)((long)puVar27 + 5),pBVar23 + (ulong)UVar17 + 4,
                                        (BYTE *)iEnd,pBVar23 + uVar16,pBVar19 + uVar16);
                    pBVar21 = (BYTE *)(sVar18 + 4);
                  }
                  else {
LAB_001307f2:
                    pBVar21 = (BYTE *)0x0;
                  }
                }
                else {
                  puVar26 = (ulong *)(pBVar19 + UVar17);
                  if (pBVar29[(long)puVar26] != *(BYTE *)((long)puVar30 + (long)pBVar29))
                  goto LAB_001307f2;
                  puVar28 = puVar30;
                  if (puVar30 < puVar1) {
                    uVar22 = *puVar30 ^ *puVar26;
                    uVar36 = 0;
                    if (uVar22 != 0) {
                      for (; (uVar22 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                      }
                    }
                    pBVar21 = (BYTE *)(uVar36 >> 3 & 0x1fffffff);
                    puVar28 = (ulong *)((long)puVar27 + 9);
                    if (*puVar26 == *puVar30) {
                      do {
                        puVar26 = puVar26 + 1;
                        if (puVar1 <= puVar28) goto LAB_001307f9;
                        uVar36 = *puVar28;
                        uVar38 = uVar36 ^ *puVar26;
                        uVar22 = 0;
                        if (uVar38 != 0) {
                          for (; (uVar38 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                          }
                        }
                        pBVar21 = (BYTE *)((long)puVar28 +
                                          ((uVar22 >> 3 & 0x1fffffff) - (long)puVar30));
                        puVar28 = puVar28 + 1;
                      } while (*puVar26 == uVar36);
                    }
                  }
                  else {
LAB_001307f9:
                    if ((puVar28 < puVar2) && ((int)*puVar26 == (int)*puVar28)) {
                      puVar28 = (ulong *)((long)puVar28 + 4);
                      puVar26 = (ulong *)((long)puVar26 + 4);
                    }
                    if ((puVar28 < puVar3) && ((short)*puVar26 == (short)*puVar28)) {
                      puVar28 = (ulong *)((long)puVar28 + 2);
                      puVar26 = (ulong *)((long)puVar26 + 2);
                    }
                    if (puVar28 < iEnd) {
                      puVar28 = (ulong *)((long)puVar28 + (ulong)((BYTE)*puVar26 == (BYTE)*puVar28))
                      ;
                    }
                    pBVar21 = (BYTE *)((long)puVar28 - (long)puVar30);
                  }
                }
                if ((pBVar29 < pBVar21) &&
                   (local_168 = (ulong)((uVar32 + 2) - UVar17), pBVar29 = pBVar21,
                   (ulong *)((long)puVar30 + (long)pBVar21) == iEnd)) {
                  bVar13 = false;
                }
                else {
                  pBVar21 = pBVar29;
                  if (uVar25 < UVar17) {
                    UVar17 = pUVar11[UVar17 & uVar40 - 1];
                    bVar13 = true;
                  }
                  else {
                    bVar13 = false;
                  }
                }
              } while (((bVar13) && (UVar34 < UVar17)) &&
                      (iVar39 = iVar39 + -1, pBVar29 = pBVar21, iVar39 != 0));
            }
            else if (uVar16 == 5) {
              uVar32 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
              pBVar19 = (ms->window).base;
              uVar40 = iVar39 - (int)pBVar19;
              uVar16 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
              UVar17 = (ms->window).lowLimit;
              UVar34 = uVar40 - uVar16;
              if (uVar40 - UVar17 <= uVar16) {
                UVar34 = UVar17;
              }
              pUVar11 = ms->chainTable;
              pBVar23 = (ms->window).dictBase;
              uVar16 = (ms->window).dictLimit;
              if (ms->loadedDictEnd != 0) {
                UVar34 = UVar17;
              }
              uVar25 = uVar40 - uVar32;
              if (uVar40 < uVar32) {
                uVar25 = 0;
              }
              uVar41 = (ms->cParams).searchLog;
              UVar17 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams_00,(BYTE *)puVar30,5);
              if (UVar34 < UVar17) {
                iVar39 = 1 << ((byte)uVar41 & 0x1f);
                local_168 = 999999999;
                pBVar29 = (BYTE *)0x3;
                do {
                  if (UVar17 < uVar16) {
                    if (pBVar23 + uVar16 < pBVar23 + (ulong)UVar17 + 4) goto LAB_00131bc7;
                    if (*(int *)(pBVar23 + UVar17) == *(int *)puVar30) {
                      sVar18 = ZSTD_count_2segments
                                         ((BYTE *)((long)puVar27 + 5),pBVar23 + (ulong)UVar17 + 4,
                                          (BYTE *)iEnd,pBVar23 + uVar16,pBVar19 + uVar16);
                      pBVar21 = (BYTE *)(sVar18 + 4);
                    }
                    else {
LAB_00130a92:
                      pBVar21 = (BYTE *)0x0;
                    }
                  }
                  else {
                    puVar26 = (ulong *)(pBVar19 + UVar17);
                    if (pBVar29[(long)puVar26] != *(BYTE *)((long)puVar30 + (long)pBVar29))
                    goto LAB_00130a92;
                    puVar28 = puVar30;
                    if (puVar30 < puVar1) {
                      uVar22 = *puVar30 ^ *puVar26;
                      uVar36 = 0;
                      if (uVar22 != 0) {
                        for (; (uVar22 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                        }
                      }
                      pBVar21 = (BYTE *)(uVar36 >> 3 & 0x1fffffff);
                      puVar28 = (ulong *)((long)puVar27 + 9);
                      if (*puVar26 == *puVar30) {
                        do {
                          puVar26 = puVar26 + 1;
                          if (puVar1 <= puVar28) goto LAB_00130a99;
                          uVar36 = *puVar28;
                          uVar38 = uVar36 ^ *puVar26;
                          uVar22 = 0;
                          if (uVar38 != 0) {
                            for (; (uVar38 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                            }
                          }
                          pBVar21 = (BYTE *)((long)puVar28 +
                                            ((uVar22 >> 3 & 0x1fffffff) - (long)puVar30));
                          puVar28 = puVar28 + 1;
                        } while (*puVar26 == uVar36);
                      }
                    }
                    else {
LAB_00130a99:
                      if ((puVar28 < puVar2) && ((int)*puVar26 == (int)*puVar28)) {
                        puVar28 = (ulong *)((long)puVar28 + 4);
                        puVar26 = (ulong *)((long)puVar26 + 4);
                      }
                      if ((puVar28 < puVar3) && ((short)*puVar26 == (short)*puVar28)) {
                        puVar28 = (ulong *)((long)puVar28 + 2);
                        puVar26 = (ulong *)((long)puVar26 + 2);
                      }
                      if (puVar28 < iEnd) {
                        puVar28 = (ulong *)((long)puVar28 +
                                           (ulong)((BYTE)*puVar26 == (BYTE)*puVar28));
                      }
                      pBVar21 = (BYTE *)((long)puVar28 - (long)puVar30);
                    }
                  }
                  if ((pBVar29 < pBVar21) &&
                     (local_168 = (ulong)((uVar40 + 2) - UVar17), pBVar29 = pBVar21,
                     (ulong *)((long)puVar30 + (long)pBVar21) == iEnd)) {
                    bVar13 = false;
                  }
                  else {
                    pBVar21 = pBVar29;
                    if (uVar25 < UVar17) {
                      UVar17 = pUVar11[UVar17 & uVar32 - 1];
                      bVar13 = true;
                    }
                    else {
                      bVar13 = false;
                    }
                  }
                } while (((bVar13) && (UVar34 < UVar17)) &&
                        (iVar39 = iVar39 + -1, pBVar29 = pBVar21, iVar39 != 0));
              }
              else {
LAB_00130dc7:
                pBVar21 = (BYTE *)0x3;
                local_168 = 999999999;
              }
            }
            else {
              uVar32 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
              pBVar19 = (ms->window).base;
              uVar40 = iVar39 - (int)pBVar19;
              uVar16 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
              UVar17 = (ms->window).lowLimit;
              UVar34 = uVar40 - uVar16;
              if (uVar40 - UVar17 <= uVar16) {
                UVar34 = UVar17;
              }
              pUVar11 = ms->chainTable;
              pBVar23 = (ms->window).dictBase;
              uVar16 = (ms->window).dictLimit;
              if (ms->loadedDictEnd != 0) {
                UVar34 = UVar17;
              }
              uVar25 = uVar40 - uVar32;
              if (uVar40 < uVar32) {
                uVar25 = 0;
              }
              uVar41 = (ms->cParams).searchLog;
              UVar17 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams_00,(BYTE *)puVar30,4);
              if (UVar17 <= UVar34) goto LAB_00130dc7;
              iVar39 = 1 << ((byte)uVar41 & 0x1f);
              local_168 = 999999999;
              pBVar29 = (BYTE *)0x3;
              do {
                if (UVar17 < uVar16) {
                  if (pBVar23 + uVar16 < pBVar23 + (ulong)UVar17 + 4) goto LAB_00131bc7;
                  if (*(int *)(pBVar23 + UVar17) == *(int *)puVar30) {
                    sVar18 = ZSTD_count_2segments
                                       ((BYTE *)((long)puVar27 + 5),pBVar23 + (ulong)UVar17 + 4,
                                        (BYTE *)iEnd,pBVar23 + uVar16,pBVar19 + uVar16);
                    pBVar21 = (BYTE *)(sVar18 + 4);
                  }
                  else {
LAB_00130d23:
                    pBVar21 = (BYTE *)0x0;
                  }
                }
                else {
                  puVar26 = (ulong *)(pBVar19 + UVar17);
                  if (pBVar29[(long)puVar26] != *(BYTE *)((long)puVar30 + (long)pBVar29))
                  goto LAB_00130d23;
                  puVar28 = puVar30;
                  if (puVar30 < puVar1) {
                    uVar22 = *puVar30 ^ *puVar26;
                    uVar36 = 0;
                    if (uVar22 != 0) {
                      for (; (uVar22 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                      }
                    }
                    pBVar21 = (BYTE *)(uVar36 >> 3 & 0x1fffffff);
                    puVar28 = (ulong *)((long)puVar27 + 9);
                    if (*puVar26 == *puVar30) {
                      do {
                        puVar26 = puVar26 + 1;
                        if (puVar1 <= puVar28) goto LAB_00130d2a;
                        uVar36 = *puVar28;
                        uVar38 = uVar36 ^ *puVar26;
                        uVar22 = 0;
                        if (uVar38 != 0) {
                          for (; (uVar38 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                          }
                        }
                        pBVar21 = (BYTE *)((long)puVar28 +
                                          ((uVar22 >> 3 & 0x1fffffff) - (long)puVar30));
                        puVar28 = puVar28 + 1;
                      } while (*puVar26 == uVar36);
                    }
                  }
                  else {
LAB_00130d2a:
                    if ((puVar28 < puVar2) && ((int)*puVar26 == (int)*puVar28)) {
                      puVar28 = (ulong *)((long)puVar28 + 4);
                      puVar26 = (ulong *)((long)puVar26 + 4);
                    }
                    if ((puVar28 < puVar3) && ((short)*puVar26 == (short)*puVar28)) {
                      puVar28 = (ulong *)((long)puVar28 + 2);
                      puVar26 = (ulong *)((long)puVar26 + 2);
                    }
                    if (puVar28 < iEnd) {
                      puVar28 = (ulong *)((long)puVar28 + (ulong)((BYTE)*puVar26 == (BYTE)*puVar28))
                      ;
                    }
                    pBVar21 = (BYTE *)((long)puVar28 - (long)puVar30);
                  }
                }
                if ((pBVar29 < pBVar21) &&
                   (local_168 = (ulong)((uVar40 + 2) - UVar17), pBVar29 = pBVar21,
                   (ulong *)((long)puVar30 + (long)pBVar21) == iEnd)) {
                  bVar13 = false;
                }
                else {
                  pBVar21 = pBVar29;
                  if (uVar25 < UVar17) {
                    UVar17 = pUVar11[UVar17 & uVar32 - 1];
                    bVar13 = true;
                  }
                  else {
                    bVar13 = false;
                  }
                }
              } while (((bVar13) && (UVar34 < UVar17)) &&
                      (iVar39 = iVar39 + -1, pBVar29 = pBVar21, iVar39 != 0));
            }
            uVar16 = (int)local_168 + 1;
            if ((uVar16 == 0) || (uVar32 = (int)local_e8 + 1, uVar32 == 0)) goto LAB_00131be6;
            bVar13 = true;
            if ((BYTE *)0x3 < pBVar21) {
              iVar39 = 0x1f;
              if (uVar16 != 0) {
                for (; uVar16 >> iVar39 == 0; iVar39 = iVar39 + -1) {
                }
              }
              uVar16 = 0x1f;
              if (uVar32 != 0) {
                for (; uVar32 >> uVar16 == 0; uVar16 = uVar16 - 1) {
                }
              }
              if ((int)((uVar16 ^ 0x1f) + (int)local_140 * 4 + -0x1b) < (int)pBVar21 * 4 - iVar39) {
                bVar13 = false;
                local_e8 = local_168;
                ip = puVar30;
                local_140 = pBVar21;
              }
            }
          } while (!bVar13);
          if (puVar4 <= puVar30) break;
          puVar30 = (ulong *)((long)puVar27 + 2);
          iVar15 = iVar33 + 2;
          if (local_e8 == 0) {
            local_e8 = 0;
          }
          else {
            uVar16 = iVar15 - UVar35;
            pBVar19 = pBVar9;
            if (uVar16 < uVar6) {
              pBVar19 = pBVar10;
            }
            if ((uVar7 < uVar16 && 2 < iVar24 - uVar16) &&
               (*(int *)puVar30 == *(int *)(pBVar19 + uVar16))) {
              puVar26 = iEnd;
              if (uVar16 < uVar6) {
                puVar26 = puVar37;
              }
              sVar18 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar27 + 6),(BYTE *)((long)(pBVar19 + uVar16) + 4)
                                  ,(BYTE *)iEnd,(BYTE *)puVar26,iStart);
              uVar16 = (int)local_e8 + 1;
              if (uVar16 == 0) goto LAB_00131be6;
              if (sVar18 < 0xfffffffffffffffc) {
                uVar32 = 0x1f;
                if (uVar16 != 0) {
                  for (; uVar16 >> uVar32 == 0; uVar32 = uVar32 - 1) {
                  }
                }
                if ((int)((uVar32 ^ 0x1f) + (int)local_140 * 4 + -0x1e) <
                    (int)(BYTE *)(sVar18 + 4) * 4) {
                  local_e8 = 0;
                  ip = puVar30;
                  local_140 = (BYTE *)(sVar18 + 4);
                }
              }
            }
          }
          uVar16 = (ms->cParams).minMatch;
          iVar33 = (int)puVar30;
          if (uVar16 - 6 < 2) {
            uVar32 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
            pBVar19 = (ms->window).base;
            uVar40 = iVar33 - (int)pBVar19;
            uVar16 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
            UVar17 = (ms->window).lowLimit;
            UVar34 = uVar40 - uVar16;
            if (uVar40 - UVar17 <= uVar16) {
              UVar34 = UVar17;
            }
            pUVar11 = ms->chainTable;
            pBVar23 = (ms->window).dictBase;
            uVar16 = (ms->window).dictLimit;
            if (ms->loadedDictEnd != 0) {
              UVar34 = UVar17;
            }
            uVar25 = uVar40 - uVar32;
            if (uVar40 < uVar32) {
              uVar25 = 0;
            }
            uVar41 = (ms->cParams).searchLog;
            UVar17 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams_00,(BYTE *)puVar30,6);
            if (UVar17 <= UVar34) goto LAB_001316fe;
            iVar33 = 1 << ((byte)uVar41 & 0x1f);
            local_168 = 999999999;
            pBVar29 = (BYTE *)0x3;
            do {
              if (UVar17 < uVar16) {
                if (pBVar23 + uVar16 < pBVar23 + (ulong)UVar17 + 4) goto LAB_00131bc7;
                if (*(int *)(pBVar23 + UVar17) == *(int *)puVar30) {
                  sVar18 = ZSTD_count_2segments
                                     ((BYTE *)((long)puVar27 + 6),pBVar23 + (ulong)UVar17 + 4,
                                      (BYTE *)iEnd,pBVar23 + uVar16,pBVar19 + uVar16);
                  pBVar21 = (BYTE *)(sVar18 + 4);
                }
                else {
LAB_00131132:
                  pBVar21 = (BYTE *)0x0;
                }
              }
              else {
                puVar26 = (ulong *)(pBVar19 + UVar17);
                if (pBVar29[(long)puVar26] != *(BYTE *)((long)puVar30 + (long)pBVar29))
                goto LAB_00131132;
                puVar28 = puVar30;
                if (puVar30 < puVar1) {
                  uVar22 = *puVar30 ^ *puVar26;
                  uVar36 = 0;
                  if (uVar22 != 0) {
                    for (; (uVar22 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                    }
                  }
                  pBVar21 = (BYTE *)(uVar36 >> 3 & 0x1fffffff);
                  puVar28 = (ulong *)((long)puVar27 + 10);
                  if (*puVar26 == *puVar30) {
                    do {
                      puVar26 = puVar26 + 1;
                      if (puVar1 <= puVar28) goto LAB_00131139;
                      uVar36 = *puVar28;
                      uVar38 = uVar36 ^ *puVar26;
                      uVar22 = 0;
                      if (uVar38 != 0) {
                        for (; (uVar38 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                        }
                      }
                      pBVar21 = (BYTE *)((long)puVar28 +
                                        ((uVar22 >> 3 & 0x1fffffff) - (long)puVar30));
                      puVar28 = puVar28 + 1;
                    } while (*puVar26 == uVar36);
                  }
                }
                else {
LAB_00131139:
                  if ((puVar28 < puVar2) && ((int)*puVar26 == (int)*puVar28)) {
                    puVar28 = (ulong *)((long)puVar28 + 4);
                    puVar26 = (ulong *)((long)puVar26 + 4);
                  }
                  if ((puVar28 < puVar3) && ((short)*puVar26 == (short)*puVar28)) {
                    puVar28 = (ulong *)((long)puVar28 + 2);
                    puVar26 = (ulong *)((long)puVar26 + 2);
                  }
                  if (puVar28 < iEnd) {
                    puVar28 = (ulong *)((long)puVar28 + (ulong)((BYTE)*puVar26 == (BYTE)*puVar28));
                  }
                  pBVar21 = (BYTE *)((long)puVar28 - (long)puVar30);
                }
              }
              if ((pBVar29 < pBVar21) &&
                 (local_168 = (ulong)((uVar40 + 2) - UVar17), pBVar29 = pBVar21,
                 (ulong *)((long)puVar30 + (long)pBVar21) == iEnd)) {
                bVar13 = false;
              }
              else {
                pBVar21 = pBVar29;
                if (uVar25 < UVar17) {
                  UVar17 = pUVar11[UVar17 & uVar32 - 1];
                  bVar13 = true;
                }
                else {
                  bVar13 = false;
                }
              }
            } while (((bVar13) && (UVar34 < UVar17)) &&
                    (iVar33 = iVar33 + -1, pBVar29 = pBVar21, iVar33 != 0));
          }
          else if (uVar16 == 5) {
            uVar41 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
            pBVar19 = (ms->window).base;
            uVar25 = iVar33 - (int)pBVar19;
            uVar40 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
            uVar16 = (ms->window).lowLimit;
            uVar32 = uVar25 - uVar40;
            if (uVar25 - uVar16 <= uVar40) {
              uVar32 = uVar16;
            }
            pUVar11 = ms->chainTable;
            pBVar23 = (ms->window).dictBase;
            uVar40 = (ms->window).dictLimit;
            if (ms->loadedDictEnd != 0) {
              uVar32 = uVar16;
            }
            uVar16 = uVar25 - uVar41;
            if (uVar25 < uVar41) {
              uVar16 = 0;
            }
            uVar8 = (ms->cParams).searchLog;
            UVar17 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams_00,(BYTE *)puVar30,5);
            if (uVar32 < UVar17) {
              iVar33 = 1 << ((byte)uVar8 & 0x1f);
              local_168 = 999999999;
              pBVar29 = (BYTE *)0x3;
              do {
                if (UVar17 < uVar40) {
                  if (pBVar23 + uVar40 < pBVar23 + (ulong)UVar17 + 4) goto LAB_00131bc7;
                  if (*(int *)(pBVar23 + UVar17) == *(int *)puVar30) {
                    sVar18 = ZSTD_count_2segments
                                       ((BYTE *)((long)puVar27 + 6),pBVar23 + (ulong)UVar17 + 4,
                                        (BYTE *)iEnd,pBVar23 + uVar40,pBVar19 + uVar40);
                    pBVar21 = (BYTE *)(sVar18 + 4);
                  }
                  else {
LAB_001313ca:
                    pBVar21 = (BYTE *)0x0;
                  }
                }
                else {
                  puVar26 = (ulong *)(pBVar19 + UVar17);
                  if (pBVar29[(long)puVar26] != *(BYTE *)((long)puVar30 + (long)pBVar29))
                  goto LAB_001313ca;
                  puVar28 = puVar30;
                  if (puVar30 < puVar1) {
                    uVar22 = *puVar30 ^ *puVar26;
                    uVar36 = 0;
                    if (uVar22 != 0) {
                      for (; (uVar22 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                      }
                    }
                    pBVar21 = (BYTE *)(uVar36 >> 3 & 0x1fffffff);
                    puVar28 = (ulong *)((long)puVar27 + 10);
                    if (*puVar26 == *puVar30) {
                      do {
                        puVar26 = puVar26 + 1;
                        if (puVar1 <= puVar28) goto LAB_001313d1;
                        uVar36 = *puVar28;
                        uVar38 = uVar36 ^ *puVar26;
                        uVar22 = 0;
                        if (uVar38 != 0) {
                          for (; (uVar38 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                          }
                        }
                        pBVar21 = (BYTE *)((long)puVar28 +
                                          ((uVar22 >> 3 & 0x1fffffff) - (long)puVar30));
                        puVar28 = puVar28 + 1;
                      } while (*puVar26 == uVar36);
                    }
                  }
                  else {
LAB_001313d1:
                    if ((puVar28 < puVar2) && ((int)*puVar26 == (int)*puVar28)) {
                      puVar28 = (ulong *)((long)puVar28 + 4);
                      puVar26 = (ulong *)((long)puVar26 + 4);
                    }
                    if ((puVar28 < puVar3) && ((short)*puVar26 == (short)*puVar28)) {
                      puVar28 = (ulong *)((long)puVar28 + 2);
                      puVar26 = (ulong *)((long)puVar26 + 2);
                    }
                    if (puVar28 < iEnd) {
                      puVar28 = (ulong *)((long)puVar28 + (ulong)((BYTE)*puVar26 == (BYTE)*puVar28))
                      ;
                    }
                    pBVar21 = (BYTE *)((long)puVar28 - (long)puVar30);
                  }
                }
                if ((pBVar29 < pBVar21) &&
                   (local_168 = (ulong)((uVar25 + 2) - UVar17), pBVar29 = pBVar21,
                   (ulong *)((long)puVar30 + (long)pBVar21) == iEnd)) {
                  bVar13 = false;
                }
                else {
                  pBVar21 = pBVar29;
                  if (uVar16 < UVar17) {
                    UVar17 = pUVar11[UVar17 & uVar41 - 1];
                    bVar13 = true;
                  }
                  else {
                    bVar13 = false;
                  }
                }
              } while (((bVar13) && (uVar32 < UVar17)) &&
                      (iVar33 = iVar33 + -1, pBVar29 = pBVar21, iVar33 != 0));
            }
            else {
LAB_001316fe:
              pBVar21 = (BYTE *)0x3;
              local_168 = 999999999;
            }
          }
          else {
            uVar41 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
            pBVar19 = (ms->window).base;
            uVar25 = iVar33 - (int)pBVar19;
            uVar40 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
            uVar16 = (ms->window).lowLimit;
            uVar32 = uVar25 - uVar40;
            if (uVar25 - uVar16 <= uVar40) {
              uVar32 = uVar16;
            }
            pUVar11 = ms->chainTable;
            pBVar23 = (ms->window).dictBase;
            uVar40 = (ms->window).dictLimit;
            if (ms->loadedDictEnd != 0) {
              uVar32 = uVar16;
            }
            uVar16 = uVar25 - uVar41;
            if (uVar25 < uVar41) {
              uVar16 = 0;
            }
            uVar8 = (ms->cParams).searchLog;
            UVar17 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams_00,(BYTE *)puVar30,4);
            if (UVar17 <= uVar32) goto LAB_001316fe;
            iVar33 = 1 << ((byte)uVar8 & 0x1f);
            local_168 = 999999999;
            pBVar29 = (BYTE *)0x3;
            do {
              if (UVar17 < uVar40) {
                if (pBVar23 + uVar40 < pBVar23 + (ulong)UVar17 + 4) goto LAB_00131bc7;
                if (*(int *)(pBVar23 + UVar17) == *(int *)puVar30) {
                  sVar18 = ZSTD_count_2segments
                                     ((BYTE *)((long)puVar27 + 6),pBVar23 + (ulong)UVar17 + 4,
                                      (BYTE *)iEnd,pBVar23 + uVar40,pBVar19 + uVar40);
                  pBVar21 = (BYTE *)(sVar18 + 4);
                }
                else {
LAB_00131654:
                  pBVar21 = (BYTE *)0x0;
                }
              }
              else {
                puVar26 = (ulong *)(pBVar19 + UVar17);
                if (pBVar29[(long)puVar26] != *(BYTE *)((long)puVar30 + (long)pBVar29))
                goto LAB_00131654;
                puVar28 = puVar30;
                if (puVar30 < puVar1) {
                  uVar22 = *puVar30 ^ *puVar26;
                  uVar36 = 0;
                  if (uVar22 != 0) {
                    for (; (uVar22 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                    }
                  }
                  pBVar21 = (BYTE *)(uVar36 >> 3 & 0x1fffffff);
                  puVar28 = (ulong *)((long)puVar27 + 10);
                  if (*puVar26 == *puVar30) {
                    do {
                      puVar26 = puVar26 + 1;
                      if (puVar1 <= puVar28) goto LAB_0013165b;
                      uVar36 = *puVar28;
                      uVar38 = uVar36 ^ *puVar26;
                      uVar22 = 0;
                      if (uVar38 != 0) {
                        for (; (uVar38 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                        }
                      }
                      pBVar21 = (BYTE *)((long)puVar28 +
                                        ((uVar22 >> 3 & 0x1fffffff) - (long)puVar30));
                      puVar28 = puVar28 + 1;
                    } while (*puVar26 == uVar36);
                  }
                }
                else {
LAB_0013165b:
                  if ((puVar28 < puVar2) && ((int)*puVar26 == (int)*puVar28)) {
                    puVar28 = (ulong *)((long)puVar28 + 4);
                    puVar26 = (ulong *)((long)puVar26 + 4);
                  }
                  if ((puVar28 < puVar3) && ((short)*puVar26 == (short)*puVar28)) {
                    puVar28 = (ulong *)((long)puVar28 + 2);
                    puVar26 = (ulong *)((long)puVar26 + 2);
                  }
                  if (puVar28 < iEnd) {
                    puVar28 = (ulong *)((long)puVar28 + (ulong)((BYTE)*puVar26 == (BYTE)*puVar28));
                  }
                  pBVar21 = (BYTE *)((long)puVar28 - (long)puVar30);
                }
              }
              if ((pBVar29 < pBVar21) &&
                 (local_168 = (ulong)((uVar25 + 2) - UVar17), pBVar29 = pBVar21,
                 (ulong *)((long)puVar30 + (long)pBVar21) == iEnd)) {
                bVar13 = false;
              }
              else {
                pBVar21 = pBVar29;
                if (uVar16 < UVar17) {
                  UVar17 = pUVar11[UVar17 & uVar41 - 1];
                  bVar13 = true;
                }
                else {
                  bVar13 = false;
                }
              }
            } while (((bVar13) && (uVar32 < UVar17)) &&
                    (iVar33 = iVar33 + -1, pBVar29 = pBVar21, iVar33 != 0));
          }
          uVar16 = (int)local_168 + 1;
          if ((uVar16 == 0) || (uVar32 = (int)local_e8 + 1, uVar32 == 0)) {
LAB_00131be6:
            __assert_fail("val != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x12c2,"U32 ZSTD_highbit32(U32)");
          }
          bVar13 = true;
          if ((BYTE *)0x3 < pBVar21) {
            iVar33 = 0x1f;
            if (uVar16 != 0) {
              for (; uVar16 >> iVar33 == 0; iVar33 = iVar33 + -1) {
              }
            }
            uVar16 = 0x1f;
            if (uVar32 != 0) {
              for (; uVar32 >> uVar16 == 0; uVar16 = uVar16 - 1) {
              }
            }
            if ((int)((uVar16 ^ 0x1f) + (int)local_140 * 4 + -0x18) < (int)pBVar21 * 4 - iVar33) {
              bVar13 = false;
              local_e8 = local_168;
              ip = puVar30;
              local_140 = pBVar21;
            }
          }
        } while (!bVar13);
LAB_001317a6:
        if (local_e8 == 0) {
          UVar34 = 1;
          UVar17 = UVar35;
        }
        else {
          pBVar29 = (BYTE *)((long)ip + (2 - (long)(pBVar9 + local_e8)));
          pBVar23 = iStart;
          pBVar19 = pBVar9;
          if ((uint)pBVar29 < uVar6) {
            pBVar23 = pBVar10 + uVar7;
            pBVar19 = pBVar10;
          }
          if ((src < ip) && (uVar36 = (ulong)pBVar29 & 0xffffffff, pBVar23 < pBVar19 + uVar36)) {
            pBVar19 = pBVar19 + uVar36;
            do {
              puVar30 = (ulong *)((long)ip + -1);
              pBVar19 = pBVar19 + -1;
              if ((*(BYTE *)puVar30 != *pBVar19) ||
                 (local_140 = local_140 + 1, ip = puVar30, puVar30 <= src)) break;
            } while (pBVar23 < pBVar19);
          }
          UVar34 = (int)local_e8 + 1;
          UVar17 = (int)local_e8 - 2;
          UVar42 = UVar35;
        }
        UVar35 = UVar17;
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
LAB_00131c05:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x2038,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < seqStore->maxNbLit) {
LAB_00131c62:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203a,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar36 = (long)ip - (long)src;
        puVar30 = (ulong *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar30 + uVar36)) {
LAB_00131c43:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (iEnd < ip) {
LAB_00131c24:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203c,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (ilimit_w < ip) {
          ZSTD_safecopyLiterals((BYTE *)puVar30,(BYTE *)src,(BYTE *)ip,(BYTE *)ilimit_w);
        }
        else {
          uVar22 = *(ulong *)((long)src + 8);
          *puVar30 = *src;
          puVar30[1] = uVar22;
          if (0x10 < uVar36) {
            pBVar19 = seqStore->lit;
            puVar30 = (ulong *)(pBVar19 + 0x10);
            puVar27 = (ulong *)((long)src + 0x10);
            if (0xffffffffffffffe8 < (ulong)((long)puVar30 + (-8 - (long)puVar27))) {
              __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1268,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            if (0xffffffffffffffe0 < (ulong)((long)puVar30 + (-0x10 - (long)puVar27))) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1270,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar22 = *(ulong *)((long)src + 0x18);
            *puVar30 = *puVar27;
            *(ulong *)(pBVar19 + 0x18) = uVar22;
            if (0x20 < (long)uVar36) {
              lVar31 = 0;
              do {
                puVar5 = (undefined8 *)((long)src + lVar31 + 0x20);
                uVar14 = puVar5[1];
                pBVar23 = pBVar19 + lVar31 + 0x20;
                *(undefined8 *)pBVar23 = *puVar5;
                *(undefined8 *)(pBVar23 + 8) = uVar14;
                puVar5 = (undefined8 *)((long)src + lVar31 + 0x30);
                uVar14 = puVar5[1];
                *(undefined8 *)(pBVar23 + 0x10) = *puVar5;
                *(undefined8 *)(pBVar23 + 0x18) = uVar14;
                lVar31 = lVar31 + 0x20;
              } while (pBVar23 + 0x20 < pBVar19 + uVar36);
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar36;
        if (0xffff < uVar36) {
          if (seqStore->longLengthID != 0) {
            __assert_fail("seqStorePtr->longLengthID == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x204d,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthID = 1;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        psVar12 = seqStore->sequences;
        psVar12->litLength = (U16)uVar36;
        psVar12->offset = UVar34;
        if ((BYTE *)0xffff < local_140 + -3) {
          if (seqStore->longLengthID != 0) {
LAB_00131c81:
            __assert_fail("seqStorePtr->longLengthID == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x2058,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar12->matchLength = (U16)(local_140 + -3);
        seqStore->sequences = psVar12 + 1;
        ip = (ulong *)((long)ip + (long)local_140);
        src = ip;
        do {
          if (puVar4 < ip) break;
          uVar16 = (uint)((long)ip - (long)(pBVar9 + UVar42));
          pBVar19 = pBVar9;
          if (uVar16 < uVar6) {
            pBVar19 = pBVar10;
          }
          if ((uVar7 < uVar16 && 2 < iVar24 - uVar16) &&
             ((int)*ip == *(int *)(pBVar19 + ((long)ip - (long)(pBVar9 + UVar42) & 0xffffffff)))) {
            puVar30 = iEnd;
            if (uVar16 < uVar6) {
              puVar30 = puVar37;
            }
            sVar18 = ZSTD_count_2segments
                               ((BYTE *)((long)ip + 4),
                                (BYTE *)((long)(pBVar19 +
                                               ((long)ip - (long)(pBVar9 + UVar42) & 0xffffffff)) +
                                        4),(BYTE *)iEnd,(BYTE *)puVar30,iStart);
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
            goto LAB_00131c05;
            if (0x20000 < seqStore->maxNbLit) goto LAB_00131c62;
            puVar30 = (ulong *)seqStore->lit;
            if (seqStore->litStart + seqStore->maxNbLit < puVar30) goto LAB_00131c43;
            if (iEnd < src) goto LAB_00131c24;
            if (ilimit_w < src) {
              ZSTD_safecopyLiterals((BYTE *)puVar30,(BYTE *)src,(BYTE *)src,(BYTE *)ilimit_w);
            }
            else {
              uVar36 = *(ulong *)((long)src + 8);
              *puVar30 = *src;
              puVar30[1] = uVar36;
            }
            psVar12 = seqStore->sequences;
            psVar12->litLength = 0;
            psVar12->offset = 1;
            if (0xffff < sVar18 + 1) {
              if (seqStore->longLengthID != 0) goto LAB_00131c81;
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar12->matchLength = (U16)(sVar18 + 1);
            seqStore->sequences = psVar12 + 1;
            ip = (ulong *)((long)ip + sVar18 + 4);
            bVar13 = true;
            src = ip;
            UVar17 = UVar35;
            UVar35 = UVar42;
          }
          else {
            bVar13 = false;
            UVar17 = UVar42;
          }
          UVar42 = UVar17;
        } while (bVar13);
      }
    } while (ip < puVar4);
  }
  *rep = UVar35;
  rep[1] = UVar42;
  return (long)iEnd - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_lazy2_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)

{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 2);
}